

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

int __thiscall jrtplib::RTPSession::ProcessPolledData(RTPSession *this)

{
  RTPSessionSources *this_00;
  RTCPScheduler *this_01;
  size_t *psVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  uint32_t ssrc;
  int iVar6;
  undefined4 extraout_var;
  _List_node_base *p_Var8;
  undefined4 extraout_var_00;
  long lVar9;
  RTPMemoryManager *pRVar10;
  RTCPCompoundPacket *pack;
  RTPTime t;
  RTPTime sendertimeout;
  RTPTime notetimeout;
  RTPTime colltimeout;
  RTPTime byetimeout;
  RTPTime generaltimeout;
  RTCPCompoundPacket *local_98;
  RTPPacketBuilder *local_90;
  timespec local_88;
  RTCPScheduler *local_78;
  list<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_> *local_70;
  RTCPPacketBuilder *local_68;
  timespec local_60;
  RTPTime local_50;
  RTPTime local_48;
  RTPTime local_40;
  RTPTime local_38;
  RTCPCompoundPacket *pRVar7;
  
  iVar5 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x20])();
  pRVar7 = (RTCPCompoundPacket *)CONCAT44(extraout_var,iVar5);
  if (pRVar7 != (RTCPCompoundPacket *)0x0) {
    this_00 = &this->sources;
    local_68 = &this->rtcpbuilder;
    local_70 = &this->byepackets;
    local_78 = &this->rtcpsched;
    local_90 = &this->packetbuilder;
    do {
      if ((this->m_changeIncomingData != true) ||
         (iVar5 = (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])(this),
         (char)iVar5 != '\0')) {
        (this->sources).owncollision = false;
        iVar5 = RTPSources::ProcessRawPacket
                          (&this_00->super_RTPSources,(RTPRawPacket *)pRVar7,this->rtptrans,
                           this->acceptownpackets);
        if (iVar5 < 0) {
LAB_0011bbeb:
          pRVar10 = (this->super_RTPMemoryObject).mgr;
          p_Var8 = (_List_node_base *)(pRVar7->super_RTPMemoryObject)._vptr_RTPMemoryObject;
          if (pRVar10 != (RTPMemoryManager *)0x0) goto LAB_0011bdee;
          goto LAB_0011be29;
        }
        if ((this->sources).owncollision == true) {
          local_88.tv_sec = pRVar7->compoundpacketlength;
          iVar5 = RTPCollisionList::UpdateAddress
                            (&this->collisionlist,*(RTPAddress **)&pRVar7->deletepacket,
                             (RTPTime *)&local_88,(bool *)&local_60);
          if (iVar5 < 0) goto LAB_0011bbeb;
          if ((char)local_60.tv_sec == '\x01') {
            if (this->sentpackets == true) {
              iVar5 = RTCPPacketBuilder::BuildBYEPacket
                                (local_68,(RTCPCompoundPacket **)&local_88,(void *)0x0,0,
                                 this->useSR_BYEifpossible);
              if (iVar5 < 0) goto LAB_0011bbeb;
              p_Var8 = (_List_node_base *)operator_new(0x18);
              p_Var8[1]._M_next = (_List_node_base *)local_88.tv_sec;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              sVar2 = (this->byepackets).
                      super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
                      ._M_impl._M_node._M_size;
              (this->byepackets).
              super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
              ._M_impl._M_node._M_size = sVar2 + 1;
              if (sVar2 == 0) {
                RTCPScheduler::ScheduleBYEPacket
                          (local_78,(size_t)((_List_node_base *)(local_88.tv_sec + 0x20))->_M_next);
              }
            }
            ssrc = RTPPacketBuilder::CreateNewSSRC(local_90,&this_00->super_RTPSources);
            this->sentpackets = false;
            iVar5 = RTPSources::DeleteOwnSSRC(&this_00->super_RTPSources);
            if ((iVar5 < 0) ||
               (iVar5 = RTPSources::CreateOwnSSRC(&this_00->super_RTPSources,ssrc), iVar5 < 0))
            goto LAB_0011bbeb;
          }
        }
      }
      pRVar10 = (this->super_RTPMemoryObject).mgr;
      pp_Var3 = (pRVar7->super_RTPMemoryObject)._vptr_RTPMemoryObject;
      if (pRVar10 == (RTPMemoryManager *)0x0) {
        (*pp_Var3[1])(pRVar7);
      }
      else {
        (**pp_Var3)(pRVar7);
        (**(code **)(*(long *)pRVar10 + 0x18))(pRVar10);
      }
      iVar5 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x20])();
      pRVar7 = (RTCPCompoundPacket *)CONCAT44(extraout_var_00,iVar5);
    } while (pRVar7 != (RTCPCompoundPacket *)0x0);
  }
  this_01 = &this->rtcpsched;
  local_90 = (RTPPacketBuilder *)RTCPScheduler::CalculateDeterministicInterval(this_01,false);
  if (RTPTime::CurrentTime()::s_initialized == '\0') {
    RTPTime::CurrentTime()::s_initialized = '\x01';
    clock_gettime(0,&local_88);
    clock_gettime(1,&local_60);
    local_88.tv_sec = (__time_t)((double)local_88.tv_nsec * 1e-09 + (double)local_88.tv_sec);
    RTPTime::CurrentTime()::s_startOffet =
         (double)local_88.tv_sec - ((double)local_60.tv_nsec * 1e-09 + (double)local_60.tv_sec);
  }
  else {
    clock_gettime(1,&local_88);
    local_88.tv_sec =
         (__time_t)
         ((double)local_88.tv_nsec * 1e-09 + (double)local_88.tv_sec +
         RTPTime::CurrentTime()::s_startOffet);
  }
  local_60.tv_sec = (__time_t)(this->sendermultiplier * (double)local_90);
  local_38.m_t = this->membermultiplier * (double)local_90;
  local_40.m_t = this->byemultiplier * (double)local_90;
  local_48.m_t = this->collisionmultiplier * (double)local_90;
  local_50.m_t = (double)local_90 * this->notemultiplier;
  RTPSources::MultipleTimeouts
            (&(this->sources).super_RTPSources,(RTPTime *)&local_88,(RTPTime *)&local_60,&local_40,
             &local_38,&local_50);
  RTPCollisionList::Timeout(&this->collisionlist,(RTPTime *)&local_88,&local_48);
  bVar4 = RTCPScheduler::IsTime(this_01);
  iVar5 = 0;
  if (!bVar4) {
    return 0;
  }
  p_Var8 = (this->byepackets).
           super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var8 == (_List_node_base *)&this->byepackets) {
    iVar6 = RTCPPacketBuilder::BuildNextPacket(&this->rtcpbuilder,&local_98);
    if (iVar6 < 0) {
      return iVar6;
    }
    iVar6 = SendRTCPData(this,local_98->compoundpacket,local_98->compoundpacketlength);
    pRVar7 = local_98;
    if (-1 < iVar6) {
      this->sentpackets = true;
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,local_98);
      pRVar7 = local_98;
      goto LAB_0011bdd3;
    }
    pRVar10 = (this->super_RTPMemoryObject).mgr;
    if (pRVar10 == (RTPMemoryManager *)0x0) {
      if (local_98 == (RTCPCompoundPacket *)0x0) {
        return iVar6;
      }
      p_Var8 = (_List_node_base *)(local_98->super_RTPMemoryObject)._vptr_RTPMemoryObject;
      goto LAB_0011be5f;
    }
    (*(code *)((_List_node_base *)(local_98->super_RTPMemoryObject)._vptr_RTPMemoryObject)->_M_next)
              (local_98);
    lVar9 = *(long *)pRVar10;
  }
  else {
    pRVar7 = (RTCPCompoundPacket *)p_Var8[1]._M_next;
    psVar1 = &(this->byepackets).
              super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    local_98 = pRVar7;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var8,0x18);
    iVar6 = SendRTCPData(this,pRVar7->compoundpacket,pRVar7->compoundpacketlength);
    if (-1 < iVar6) {
      this->sentpackets = true;
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x14])(this,pRVar7);
      p_Var8 = (this->byepackets).
               super__List_base<jrtplib::RTCPCompoundPacket_*,_std::allocator<jrtplib::RTCPCompoundPacket_*>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var8 != (_List_node_base *)&this->byepackets) {
        RTCPScheduler::ScheduleBYEPacket(this_01,(size_t)p_Var8[1]._M_next[2]._M_next);
      }
LAB_0011bdd3:
      RTCPScheduler::AnalyseOutgoing(this_01,pRVar7);
      pRVar10 = (this->super_RTPMemoryObject).mgr;
      pRVar7 = local_98;
      if (pRVar10 != (RTPMemoryManager *)0x0) {
        p_Var8 = (_List_node_base *)(local_98->super_RTPMemoryObject)._vptr_RTPMemoryObject;
LAB_0011bdee:
        (*(code *)p_Var8->_M_next)(pRVar7);
        (**(code **)(*(long *)pRVar10 + 0x18))(pRVar10,pRVar7);
        return iVar5;
      }
      if (local_98 == (RTCPCompoundPacket *)0x0) {
        return 0;
      }
      p_Var8 = (_List_node_base *)(local_98->super_RTPMemoryObject)._vptr_RTPMemoryObject;
LAB_0011be29:
      (*(code *)p_Var8->_M_prev)(pRVar7);
      return iVar5;
    }
    pRVar10 = (this->super_RTPMemoryObject).mgr;
    p_Var8 = (_List_node_base *)(pRVar7->super_RTPMemoryObject)._vptr_RTPMemoryObject;
    if (pRVar10 == (RTPMemoryManager *)0x0) {
LAB_0011be5f:
      (*(code *)p_Var8->_M_prev)(pRVar7);
      return iVar6;
    }
    (*(code *)p_Var8->_M_next)(pRVar7);
    lVar9 = *(long *)pRVar10;
  }
  (**(code **)(lVar9 + 0x18))(pRVar10,pRVar7);
  return iVar6;
}

Assistant:

int RTPSession::ProcessPolledData()
{
	RTPRawPacket *rawpack;
	int status;
	
	SOURCES_LOCK
	while ((rawpack = rtptrans->GetNextPacket()) != 0)
	{
		if (m_changeIncomingData)
		{
			// Provide a way to change incoming data, for decryption for example
			if (!OnChangeIncomingData(rawpack))
			{
				RTPDelete(rawpack,GetMemoryManager());
				continue;
			}
		}

		sources.ClearOwnCollisionFlag();

		// since our sources instance also uses the scheduler (analysis of incoming packets)
		// we'll lock it
		SCHED_LOCK
		if ((status = sources.ProcessRawPacket(rawpack,rtptrans,acceptownpackets)) < 0)
		{
			SCHED_UNLOCK
			SOURCES_UNLOCK
			RTPDelete(rawpack,GetMemoryManager());
			return status;
		}
		SCHED_UNLOCK
				
		if (sources.DetectedOwnCollision()) // collision handling!
		{
			bool created;
			
			if ((status = collisionlist.UpdateAddress(rawpack->GetSenderAddress(),rawpack->GetReceiveTime(),&created)) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(rawpack,GetMemoryManager());
				return status;
			}

			if (created) // first time we've encountered this address, send bye packet and
			{            // change our own SSRC
				PACKSENT_LOCK
				bool hassentpackets = sentpackets;
				PACKSENT_UNLOCK

				if (hassentpackets)
				{
					// Only send BYE packet if we've actually sent data using this
					// SSRC
					
					RTCPCompoundPacket *rtcpcomppack;

					BUILDER_LOCK
					if ((status = rtcpbuilder.BuildBYEPacket(&rtcpcomppack,0,0,useSR_BYEifpossible)) < 0)
					{
						BUILDER_UNLOCK
						SOURCES_UNLOCK
						RTPDelete(rawpack,GetMemoryManager());
						return status;
					}
					BUILDER_UNLOCK

					byepackets.push_back(rtcpcomppack);
					if (byepackets.size() == 1) // was the first packet, schedule a BYE packet (otherwise there's already one scheduled)
					{
						SCHED_LOCK
						rtcpsched.ScheduleBYEPacket(rtcpcomppack->GetCompoundPacketLength());
						SCHED_UNLOCK
					}
				}
				// bye packet is built and scheduled, now change our SSRC
				// and reset the packet count in the transmitter
				
				BUILDER_LOCK
				uint32_t newssrc = packetbuilder.CreateNewSSRC(sources);
				BUILDER_UNLOCK
					
				PACKSENT_LOCK
				sentpackets = false;
				PACKSENT_UNLOCK
	
				// remove old entry in source table and add new one

				if ((status = sources.DeleteOwnSSRC()) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
				if ((status = sources.CreateOwnSSRC(newssrc)) < 0)
				{
					SOURCES_UNLOCK
					RTPDelete(rawpack,GetMemoryManager());
					return status;
				}
			}
		}
		RTPDelete(rawpack,GetMemoryManager());
	}

	SCHED_LOCK
	RTPTime d = rtcpsched.CalculateDeterministicInterval(false);
	SCHED_UNLOCK
	
	RTPTime t = RTPTime::CurrentTime();
	double Td = d.GetDouble();
	RTPTime sendertimeout = RTPTime(Td*sendermultiplier);
	RTPTime generaltimeout = RTPTime(Td*membermultiplier);
	RTPTime byetimeout = RTPTime(Td*byemultiplier);
	RTPTime colltimeout = RTPTime(Td*collisionmultiplier);
	RTPTime notetimeout = RTPTime(Td*notemultiplier);
	
	sources.MultipleTimeouts(t,sendertimeout,byetimeout,generaltimeout,notetimeout);
	collisionlist.Timeout(t,colltimeout);
	
	// We'll check if it's time for RTCP stuff

	SCHED_LOCK
	bool istime = rtcpsched.IsTime();
	SCHED_UNLOCK
	
	if (istime)
	{
		RTCPCompoundPacket *pack;
	
		// we'll check if there's a bye packet to send, or just a normal packet

		if (byepackets.empty())
		{
			BUILDER_LOCK
			if ((status = rtcpbuilder.BuildNextPacket(&pack)) < 0)
			{
				BUILDER_UNLOCK
				SOURCES_UNLOCK
				return status;
			}
			BUILDER_UNLOCK
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
		
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
		}
		else
		{
			pack = *(byepackets.begin());
			byepackets.pop_front();
			
			if ((status = SendRTCPData(pack->GetCompoundPacketData(),pack->GetCompoundPacketLength())) < 0)
			{
				SOURCES_UNLOCK
				RTPDelete(pack,GetMemoryManager());
				return status;
			}
			
			PACKSENT_LOCK
			sentpackets = true;
			PACKSENT_UNLOCK

			OnSendRTCPCompoundPacket(pack); // we'll place this after the actual send to avoid tampering
			
			if (!byepackets.empty()) // more bye packets to send, schedule them
			{
				SCHED_LOCK
				rtcpsched.ScheduleBYEPacket((*(byepackets.begin()))->GetCompoundPacketLength());
				SCHED_UNLOCK
			}
		}
		
		SCHED_LOCK
		rtcpsched.AnalyseOutgoing(*pack);
		SCHED_UNLOCK

		RTPDelete(pack,GetMemoryManager());
	}
	SOURCES_UNLOCK
	return 0;
}